

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O2

CURLcode create_conn(Curl_easy *data,connectdata **in_connect,_Bool *async)

{
  urlpieces *part;
  undefined1 *puVar1;
  hostname *host;
  char **ppcVar2;
  char **ppcVar3;
  ssl_primary_config *dest;
  byte bVar4;
  uchar uVar5;
  curl_slist *pcVar6;
  conncache *pcVar7;
  Curl_share *pCVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined4 uVar11;
  undefined8 uVar12;
  undefined4 uVar13;
  void *pvVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  bool bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  curl_proxytype proxytype;
  bool bVar20;
  char cVar21;
  _Bool _Var22;
  ushort uVar23;
  CURLUcode CVar24;
  int iVar25;
  CURLcode CVar26;
  CURLcode CVar27;
  resolve_t rVar28;
  size_t sVar29;
  connectdata *conn;
  ssl_backend_data *psVar30;
  char *pcVar31;
  CURLU *u;
  size_t sVar32;
  size_t sVar33;
  Curl_handler *pCVar34;
  char **passwordp;
  byte *pbVar35;
  long lVar36;
  ulong uVar37;
  timediff_t tVar38;
  connectbundle *pcVar39;
  connectdata *pcVar40;
  byte bVar41;
  byte bVar42;
  byte bVar43;
  uint uVar44;
  uint uVar45;
  uint uVar46;
  char *pcVar47;
  char **ppcVar48;
  Curl_llist_element *pCVar49;
  uint uVar50;
  byte *__s;
  char **ppcVar51;
  char *pcVar52;
  byte *pbVar53;
  bool bVar54;
  bool bVar55;
  bool bVar56;
  bool bVar57;
  curltime cVar58;
  curltime newer;
  curltime newer_00;
  curltime older;
  curltime older_00;
  curl_slist **local_160;
  proxy_info *local_138;
  ulong local_120;
  connectdata *local_118;
  byte *local_110;
  int local_ec;
  char **local_e8;
  size_t local_e0;
  proxy_info *local_d8;
  proxy_info *local_d0;
  hostname *local_c8;
  hostname *local_c0;
  char *newurl;
  connectdata *pcStack_b0;
  undefined1 auStack_a8 [14];
  undefined2 local_9a;
  undefined1 auStack_98 [14];
  
  sVar29 = Curl_multi_max_host_connections(data->multi);
  local_e0 = Curl_multi_max_total_connections(data->multi);
  *async = false;
  *in_connect = (connectdata *)0x0;
  if ((data->state).url == (char *)0x0) {
    return CURLE_URL_MALFORMAT;
  }
  conn = (connectdata *)(*Curl_ccalloc)(1,0x588);
  if (conn == (connectdata *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  sVar32 = Curl_ssl->sizeof_ssl_backend_data;
  psVar30 = (ssl_backend_data *)(*Curl_ccalloc)(1,sVar32 * 4);
  if (psVar30 == (ssl_backend_data *)0x0) {
    (*Curl_cfree)(conn);
switchD_004a384f_caseD_7:
    CVar26 = CURLE_OUT_OF_MEMORY;
  }
  else {
    conn->ssl_extra = psVar30;
    conn->ssl[0].backend = psVar30;
    psVar30 = (ssl_backend_data *)((long)&psVar30->logger + sVar32);
    conn->ssl[1].backend = psVar30;
    psVar30 = (ssl_backend_data *)((long)&psVar30->logger + sVar32);
    conn->proxy_ssl[0].backend = psVar30;
    conn->proxy_ssl[1].backend = (ssl_backend_data *)((long)&psVar30->logger + sVar32);
    conn->handler = &Curl_handler_dummy;
    conn->connection_id = -1;
    conn->port = -1;
    conn->remote_port = -1;
    conn->sock[0] = -1;
    conn->sock[1] = -1;
    conn->tempsock[0] = -1;
    conn->tempsock[1] = -1;
    Curl_conncontrol(conn,1);
    cVar58 = Curl_now();
    (conn->created).tv_sec = cVar58.tv_sec;
    (conn->created).tv_usec = cVar58.tv_usec;
    cVar58 = Curl_now();
    (conn->keepalive).tv_sec = cVar58.tv_sec;
    (conn->keepalive).tv_usec = cVar58.tv_usec;
    bVar43 = (data->set).proxytype;
    (conn->http_proxy).proxytype = bVar43;
    (conn->socks_proxy).proxytype = '\x04';
    pcVar31 = (data->set).str[0x15];
    uVar44 = 0;
    if (pcVar31 != (char *)0x0) {
      uVar44 = (uint)(*pcVar31 != '\0') << 5;
    }
    uVar46 = (uint)(bVar43 >= 3 || uVar44 == 0) * 2;
    uVar45 = *(uint *)&(conn->bits).field_0x4;
    if (uVar44 == 0) {
      uVar46 = 0;
    }
    uVar50 = (uint)(bVar43 < 3 && uVar44 != 0);
    uVar44 = uVar46 | uVar44 | uVar45 & 0xffffffdc | uVar50;
    *(uint *)&(conn->bits).field_0x4 = uVar44;
    pcVar31 = (data->set).str[0x16];
    if ((pcVar31 != (char *)0x0) && (*pcVar31 != '\0')) {
      uVar44 = uVar45 & 0xffffffde | uVar50 | 0x22;
      *(uint *)&(conn->bits).field_0x4 = uVar44;
    }
    uVar44 = (uVar44 & 0xfffffffb) + (uint)((data->state).aptr.proxyuser != (char *)0x0) * 4;
    *(uint *)&(conn->bits).field_0x4 = uVar44;
    uVar45 = *(uint *)&(data->set).field_0x8e2 >> 3 & 8;
    *(uint *)&(conn->bits).field_0x4 = uVar44 & 0xfffffff7 | uVar45;
    uVar46 = (*(uint *)&(data->set).field_0x8e2 & 0x800) << 7;
    *(uint *)&(conn->bits).field_0x4 = uVar44 & 0xfffbfff7 | uVar45 | uVar46;
    *(uint *)&(conn->bits).field_0x4 =
         uVar44 & 0xfff3fff7 | uVar45 | uVar46 | (*(uint *)&(data->set).field_0x8e2 & 0x1000) << 7;
    bVar41 = (data->set).ssl.primary.field_0x71 & 4;
    bVar43 = (conn->ssl_config).field_0x71;
    bVar4 = (conn->proxy_ssl_config).field_0x71;
    (conn->ssl_config).field_0x71 = bVar43 & 0xfb | bVar41;
    bVar42 = (data->set).ssl.primary.field_0x71 & 1;
    (conn->ssl_config).field_0x71 = bVar43 & 0xfa | bVar41 | bVar42;
    (conn->ssl_config).field_0x71 =
         bVar43 & 0xf8 | bVar41 | bVar42 | (data->set).ssl.primary.field_0x71 & 2;
    (conn->ssl_config).ssl_options = (data->set).ssl.primary.ssl_options;
    bVar43 = (data->set).proxy_ssl.primary.field_0x71 & 4;
    (conn->proxy_ssl_config).field_0x71 = bVar4 & 0xfb | bVar43;
    bVar41 = (data->set).proxy_ssl.primary.field_0x71 & 1;
    (conn->proxy_ssl_config).field_0x71 = bVar4 & 0xfa | bVar43 | bVar41;
    (conn->proxy_ssl_config).field_0x71 =
         bVar4 & 0xf8 | bVar43 | bVar41 | (data->set).proxy_ssl.primary.field_0x71 & 2;
    (conn->proxy_ssl_config).ssl_options = (data->set).proxy_ssl.primary.ssl_options;
    conn->ip_version = (data->set).ipver;
    conn->connect_only = (data->set).connect_only;
    conn->transport = '\x03';
    Curl_llist_init(&conn->easyq,(Curl_llist_dtor)0x0);
    pcVar31 = (data->set).str[8];
    if (pcVar31 != (char *)0x0) {
      pcVar31 = (*Curl_cstrdup)(pcVar31);
      conn->localdev = pcVar31;
      if (pcVar31 == (char *)0x0) {
        Curl_llist_destroy(&conn->easyq,(void *)0x0);
        (*Curl_cfree)(conn->localdev);
        (*Curl_cfree)(conn->ssl_extra);
        (*Curl_cfree)(conn);
        goto switchD_004a384f_caseD_7;
      }
    }
    conn->localportrange = (data->set).localportrange;
    conn->localport = (data->set).localport;
    pvVar14 = (data->set).closesocket_client;
    conn->fclosesocket = (data->set).fclosesocket;
    conn->closesocket_client = pvVar14;
    cVar58 = Curl_now();
    (conn->lastused).tv_sec = cVar58.tv_sec;
    (conn->lastused).tv_usec = cVar58.tv_usec;
    *in_connect = conn;
    if ((data->set).uh == (CURLU *)0x0) {
      bVar54 = false;
    }
    else {
      bVar54 = ((data->state).field_0x6d0 & 2) == 0;
    }
    up_free(data);
    if (bVar54) {
      u = curl_url_dup((data->set).uh);
    }
    else {
      u = curl_url();
    }
    (data->state).uh = u;
    if (u == (CURLU *)0x0) goto switchD_004a384f_caseD_7;
    if (((data->set).str[7] != (char *)0x0) &&
       (sVar32 = Curl_is_absolute_url((data->state).url,(char *)0x0,0,true), sVar32 == 0)) {
      pcVar31 = curl_maprintf("%s://%s",(data->set).str[7],(data->state).url);
      if (pcVar31 == (char *)0x0) goto switchD_004a384f_caseD_7;
      uVar44 = *(uint *)&(data->state).field_0x6d0;
      if ((uVar44 >> 0x11 & 1) != 0) {
        (*Curl_cfree)((data->state).url);
        uVar44 = *(uint *)&(data->state).field_0x6d0;
      }
      (data->state).url = pcVar31;
      *(uint *)&(data->state).field_0x6d0 = uVar44 | 0x20000;
    }
    if (!bVar54) {
      uVar44 = (uint)((ulong)*(undefined8 *)&(data->set).field_0x8e2 >> 0x20);
      CVar24 = curl_url_set(u,CURLUPART_URL,(data->state).url,
                            (uVar44 >> 0xb & 0x20) + (uVar44 >> 5 & 0x10) + 0x208);
      switch(CVar24) {
      case CURLUE_OK:
        CVar24 = curl_url_get(u,CURLUPART_URL,&newurl,0);
        switch(CVar24) {
        case CURLUE_OK:
          uVar44 = *(uint *)&(data->state).field_0x6d0;
          if ((uVar44 >> 0x11 & 1) != 0) {
            (*Curl_cfree)((data->state).url);
            uVar44 = *(uint *)&(data->state).field_0x6d0;
          }
          (data->state).url = newurl;
          *(uint *)&(data->state).field_0x6d0 = uVar44 | 0x20000;
          break;
        default:
          return CURLE_URL_MALFORMAT;
        case CURLUE_UNSUPPORTED_SCHEME:
          goto switchD_004a3919_caseD_5;
        case CURLUE_OUT_OF_MEMORY:
          goto switchD_004a3919_caseD_7;
        case CURLUE_USER_NOT_ALLOWED:
          goto switchD_004a384f_caseD_8;
        }
        break;
      default:
        return CURLE_URL_MALFORMAT;
      case CURLUE_UNSUPPORTED_SCHEME:
switchD_004a3919_caseD_5:
        return CURLE_UNSUPPORTED_PROTOCOL;
      case CURLUE_OUT_OF_MEMORY:
        goto switchD_004a3919_caseD_7;
      case CURLUE_USER_NOT_ALLOWED:
        goto switchD_004a384f_caseD_8;
      }
    }
    part = &(data->state).up;
    CVar24 = curl_url_get(u,CURLUPART_SCHEME,&part->scheme,0);
    switch(CVar24) {
    case CURLUE_OK:
      ppcVar48 = &(data->state).up.hostname;
      CVar24 = curl_url_get(u,CURLUPART_HOST,ppcVar48,0);
      if (CVar24 == CURLUE_OK) {
        pcVar31 = *ppcVar48;
        sVar33 = strlen(pcVar31);
        if (sVar33 < 0x10000) goto LAB_004a39c4;
        Curl_failf(data,"Too long host name (maximum is %d)",0xffff);
        goto switchD_004a384f_caseD_1;
      }
      iVar25 = Curl_strcasecompare("file",part->scheme);
      if (iVar25 == 0) goto switchD_004a384f_caseD_7;
      pcVar31 = *ppcVar48;
LAB_004a39c4:
      if (pcVar31 == (char *)0x0) {
        pcVar52 = (char *)0x0;
      }
      else {
        pcVar52 = pcVar31;
        if (*pcVar31 == '[') {
          puVar1 = &(conn->bits).field_0x5;
          *puVar1 = *puVar1 | 8;
          pcVar52 = pcVar31 + 1;
          sVar33 = strlen(pcVar52);
          pcVar31[sVar33] = '\0';
          zonefrom_url(u,data,conn);
        }
      }
      if (pcVar52 == (char *)0x0) {
        pcVar52 = "";
      }
      pcVar31 = (*Curl_cstrdup)(pcVar52);
      (conn->host).rawalloc = pcVar31;
      if (pcVar31 == (char *)0x0) goto switchD_004a384f_caseD_7;
      host = &conn->host;
      (conn->host).name = pcVar31;
      Curl_idnconvert_hostname(data,host);
      uVar44 = *(uint *)&(conn->bits).field_0x4;
      if ((uVar44 >> 9 & 1) != 0) {
        Curl_idnconvert_hostname(data,&conn->conn_to_host);
        uVar44 = *(uint *)&(conn->bits).field_0x4;
      }
      if ((uVar44 & 1) != 0) {
        Curl_idnconvert_hostname(data,&(conn->http_proxy).host);
        uVar44 = *(uint *)&(conn->bits).field_0x4;
      }
      if ((uVar44 & 2) != 0) {
        Curl_idnconvert_hostname(data,&(conn->socks_proxy).host);
      }
      pcVar31 = part->scheme;
      pCVar34 = Curl_builtin_scheme(pcVar31,0xffffffffffffffff);
      if (((pCVar34 == (Curl_handler *)0x0) ||
          (((data->set).allowed_protocols & pCVar34->protocol) == 0)) ||
         ((((data->state).field_0x6d0 & 2) != 0 &&
          (((data->set).redir_protocols & pCVar34->protocol) == 0)))) {
        Curl_failf(data,"Protocol \"%s\" not supported or disabled in libcurl",pcVar31);
        goto switchD_004a3b53_caseD_5;
      }
      conn->given = pCVar34;
      conn->handler = pCVar34;
      ppcVar48 = &(data->state).aptr.passwd;
      local_c0 = host;
      if ((data->state).aptr.passwd == (char *)0x0) {
        ppcVar2 = &(data->state).up.password;
        CVar26 = CURLE_URL_MALFORMAT;
        CVar24 = curl_url_get(u,CURLUPART_PASSWORD,ppcVar2,0);
        switch(CVar24) {
        case CURLUE_UNSUPPORTED_SCHEME:
          goto switchD_004a3b53_caseD_5;
        case CURLUE_URLDECODE:
        case CURLUE_UNKNOWN_PART:
        case CURLUE_NO_SCHEME:
        case CURLUE_NO_USER:
          goto switchD_004a3919_caseD_1;
        case CURLUE_OUT_OF_MEMORY:
          goto switchD_004a384f_caseD_7;
        case CURLUE_USER_NOT_ALLOWED:
          goto switchD_004a384f_caseD_8;
        case CURLUE_NO_PASSWORD:
          break;
        default:
          if (CVar24 != CURLUE_OK) {
            return CURLE_URL_MALFORMAT;
          }
          CVar26 = Curl_urldecode(*ppcVar2,0,&newurl,(size_t *)0x0,
                                  ((conn->handler->flags >> 0xd & 1) != 0) + REJECT_CTRL);
          if (CVar26 != CURLE_OK) {
            return CVar26;
          }
          conn->passwd = newurl;
          CVar26 = Curl_setstropt(ppcVar48,newurl);
          if (CVar26 != CURLE_OK) {
            return CVar26;
          }
        }
      }
      if ((data->set).str[0x2a] == (char *)0x0) {
        ppcVar2 = &(data->state).up.user;
        CVar24 = curl_url_get(u,CURLUPART_USER,ppcVar2,0);
        switch(CVar24) {
        case CURLUE_OK:
          CVar26 = Curl_urldecode(*ppcVar2,0,&newurl,(size_t *)0x0,
                                  ((conn->handler->flags >> 0xd & 1) != 0) + REJECT_CTRL);
          if (CVar26 != CURLE_OK) {
            return CVar26;
          }
          conn->user = newurl;
          pcVar31 = newurl;
          break;
        default:
          goto switchD_004a384f_caseD_1;
        case CURLUE_UNSUPPORTED_SCHEME:
          goto switchD_004a3b53_caseD_5;
        case CURLUE_OUT_OF_MEMORY:
          goto switchD_004a384f_caseD_7;
        case CURLUE_USER_NOT_ALLOWED:
          goto switchD_004a384f_caseD_8;
        case CURLUE_NO_USER:
          if (*ppcVar48 == (char *)0x0) goto LAB_004a3b21;
          pcVar31 = "";
        }
        CVar26 = Curl_setstropt(&(data->state).aptr.user,pcVar31);
        if (CVar26 != CURLE_OK) {
          return CVar26;
        }
      }
LAB_004a3b21:
      ppcVar2 = &(data->state).up.options;
      CVar24 = curl_url_get(u,CURLUPART_OPTIONS,ppcVar2,0x40);
      switch(CVar24) {
      case CURLUE_UNSUPPORTED_SCHEME:
switchD_004a3b53_caseD_5:
        CVar26 = CURLE_UNSUPPORTED_PROTOCOL;
        break;
      case CURLUE_OUT_OF_MEMORY:
        goto switchD_004a384f_caseD_7;
      case CURLUE_USER_NOT_ALLOWED:
        goto switchD_004a384f_caseD_8;
      case CURLUE_NO_OPTIONS:
switchD_004a3b53_caseD_d:
        CVar24 = curl_url_get(u,CURLUPART_PATH,&(data->state).up.path,0x80);
        switch(CVar24) {
        case CURLUE_OK:
          CVar24 = curl_url_get(u,CURLUPART_PORT,&(data->state).up.port,1);
          if (CVar24 == CURLUE_OK) {
            uVar37 = strtoul((data->state).up.port,(char **)0x0,10);
            uVar23 = (data->set).use_port;
            if ((uVar23 == 0) || (((data->state).field_0x6d0 & 0x10) == 0)) {
              uVar23 = curlx_ultous(uVar37);
            }
            conn->remote_port = (uint)uVar23;
            conn->port = (uint)uVar23;
          }
          else {
            iVar25 = Curl_strcasecompare("file",part->scheme);
            if (iVar25 == 0) goto switchD_004a384f_caseD_7;
          }
          curl_url_get(u,CURLUPART_QUERY,&(data->state).up.query,0);
          uVar44 = (data->set).scope_id;
          if (uVar44 != 0) {
            conn->scope_id = uVar44;
          }
          pcVar31 = (data->set).str[0x46];
          if (pcVar31 != (char *)0x0) {
            pcVar31 = (*Curl_cstrdup)(pcVar31);
            conn->sasl_authzid = pcVar31;
            if (pcVar31 == (char *)0x0) goto switchD_004a384f_caseD_7;
          }
          pcVar31 = (data->set).str[0x40];
          if (pcVar31 != (char *)0x0) {
            pcVar31 = (*Curl_cstrdup)(pcVar31);
            conn->oauth_bearer = pcVar31;
            if (pcVar31 == (char *)0x0) goto switchD_004a384f_caseD_7;
          }
          if (((conn->bits).field_0x4 & 4) == 0) {
LAB_004a3e00:
            pcVar31 = (data->set).str[0x15];
            if (pcVar31 == (char *)0x0) {
              local_160 = (curl_slist **)0x0;
            }
            else {
              local_160 = (curl_slist **)(*Curl_cstrdup)(pcVar31);
              if (local_160 == (curl_slist **)0x0) {
                Curl_failf(data,"memory shortage");
                CVar26 = CURLE_OUT_OF_MEMORY;
                goto LAB_004a422c;
              }
            }
            pcVar31 = (data->set).str[0x16];
            if (pcVar31 == (char *)0x0) {
              pcVar31 = (char *)0x0;
LAB_004a3f02:
              if ((data->set).str[0x2f] == (char *)0x0) {
                pcVar47 = "no_proxy";
                pcVar52 = curl_getenv("no_proxy");
                if (pcVar52 == (char *)0x0) {
                  pcVar47 = "NO_PROXY";
                  pcVar52 = curl_getenv("NO_PROXY");
                  if (pcVar52 == (char *)0x0) goto LAB_004a3f0c;
                }
                Curl_infof(data,"Uses proxy env variable %s == \'%s\'",pcVar47,pcVar52);
              }
              else {
LAB_004a3f0c:
                pcVar52 = (char *)0x0;
              }
              pcVar47 = (data->set).str[0x2f];
              if (pcVar47 == (char *)0x0) {
                pcVar47 = pcVar52;
              }
              _Var22 = Curl_check_noproxy((conn->host).name,pcVar47);
              if (_Var22) {
                (*Curl_cfree)(local_160);
                (*Curl_cfree)(pcVar31);
LAB_004a3f86:
                local_160 = (curl_slist **)0x0;
LAB_004a40e8:
                pcVar31 = (char *)0x0;
              }
              else if (local_160 == (curl_slist **)0x0 && pcVar31 == (char *)0x0) {
                pcVar31 = conn->handler->scheme;
                for (lVar36 = 0; cVar21 = pcVar31[lVar36], cVar21 != '\0'; lVar36 = lVar36 + 1) {
                  cVar21 = Curl_raw_tolower(cVar21);
                  *(char *)((long)&newurl + lVar36) = cVar21;
                }
                *(undefined4 *)((long)&newurl + lVar36 + 3) = 0x79786f;
                *(undefined4 *)((long)&newurl + lVar36) = 0x6f72705f;
                pcVar31 = (char *)&newurl;
                local_160 = (curl_slist **)curl_getenv(pcVar31);
                if (local_160 == (curl_slist **)0x0) {
                  pcVar31 = (char *)&newurl;
                  iVar25 = Curl_strcasecompare("http_proxy",pcVar31);
                  if (iVar25 == 0) {
                    Curl_strntoupper(pcVar31,pcVar31,0x80);
                    local_160 = (curl_slist **)curl_getenv(pcVar31);
                    if (local_160 != (curl_slist **)0x0) goto LAB_004a40cf;
                  }
                  pcVar31 = "all_proxy";
                  local_160 = (curl_slist **)curl_getenv("all_proxy");
                  if (local_160 == (curl_slist **)0x0) {
                    pcVar31 = "ALL_PROXY";
                    local_160 = (curl_slist **)curl_getenv("ALL_PROXY");
                    if (local_160 == (curl_slist **)0x0) goto LAB_004a3f86;
                  }
                }
LAB_004a40cf:
                Curl_infof(data,"Uses proxy env variable %s == \'%s\'",pcVar31,local_160);
                goto LAB_004a40e8;
              }
              (*Curl_cfree)(pcVar52);
              if (local_160 == (curl_slist **)0x0) {
LAB_004a4126:
                local_160 = (curl_slist **)0x0;
              }
              else if ((*(char *)local_160 == '\0') || ((conn->handler->flags & 0x10) != 0)) {
                (*Curl_cfree)(local_160);
                goto LAB_004a4126;
              }
              if (pcVar31 == (char *)0x0) {
LAB_004a4182:
                if (local_160 != (curl_slist **)0x0) {
                  proxytype = (curl_proxytype)(conn->http_proxy).proxytype;
                  pcVar31 = (char *)0x0;
                  bVar54 = false;
LAB_004a41ab:
                  CVar26 = parse_proxy(data,conn,(char *)local_160,proxytype);
                  (*Curl_cfree)(local_160);
                  if (CVar26 == CURLE_OK) {
                    if (bVar54) goto LAB_004a41f9;
                    goto LAB_004a48d7;
                  }
                  local_160 = (curl_slist **)0x0;
                  goto LAB_004a422e;
                }
                uVar44 = *(uint *)&(conn->bits).field_0x4 & 0xfffffffc;
              }
              else {
                if ((*pcVar31 == '\0') || ((conn->handler->flags & 0x10) != 0)) {
                  (*Curl_cfree)(pcVar31);
                  goto LAB_004a4182;
                }
                proxytype = (curl_proxytype)(conn->http_proxy).proxytype;
                bVar54 = true;
                if (local_160 != (curl_slist **)0x0) goto LAB_004a41ab;
LAB_004a41f9:
                CVar26 = parse_proxy(data,conn,pcVar31,proxytype);
                (*Curl_cfree)(pcVar31);
                if (CVar26 != CURLE_OK) goto LAB_004a422c;
LAB_004a48d7:
                local_138 = &conn->http_proxy;
                if ((local_138->host).rawalloc == (char *)0x0) {
                  uVar44 = *(uint *)&(conn->bits).field_0x4 & 0xfffffff6;
                  *(uint *)&(conn->bits).field_0x4 = uVar44;
                  if ((conn->socks_proxy).host.rawalloc == (char *)0x0) goto LAB_004a4ea9;
                  if ((conn->socks_proxy).user == (char *)0x0) {
                    pcVar31 = (conn->socks_proxy).passwd;
                    (conn->socks_proxy).user = (conn->http_proxy).user;
                    (conn->http_proxy).user = (char *)0x0;
                    (*Curl_cfree)(pcVar31);
                    (conn->socks_proxy).passwd = (conn->http_proxy).passwd;
                    (conn->http_proxy).passwd = (char *)0x0;
                    uVar44 = *(uint *)&(conn->bits).field_0x4;
                  }
                }
                else {
                  uVar44 = *(uint *)&(conn->bits).field_0x4;
                  if ((conn->handler->protocol & 3) == 0) {
                    if (((conn->handler->flags & 0x800) == 0) || ((uVar44 & 8) != 0)) {
                      uVar44 = uVar44 | 8;
                    }
                    else {
                      conn->handler = &Curl_handler_http;
                    }
                  }
                  uVar44 = uVar44 | 1;
                  if ((conn->socks_proxy).host.rawalloc == (char *)0x0) {
LAB_004a4ea9:
                    uVar44 = uVar44 & 0xfffffffd;
                    goto LAB_004a4eac;
                  }
                }
                uVar44 = uVar44 | 2;
              }
LAB_004a4eac:
              uVar45 = 0x20;
              if ((uVar44 & 1) == 0) {
                uVar45 = (uVar44 & 2) << 4;
              }
              *(uint *)&(conn->bits).field_0x4 = uVar44 & 0xffffffdf | uVar45;
              if (uVar45 == 0) {
                *(uint *)&(conn->bits).field_0x4 = uVar44 & 0xffffffd0;
                (conn->http_proxy).proxytype = '\0';
              }
              local_160 = (curl_slist **)0x0;
              pcVar31 = (char *)0x0;
              CVar26 = CURLE_OK;
            }
            else {
              pcVar31 = (*Curl_cstrdup)(pcVar31);
              if (pcVar31 != (char *)0x0) goto LAB_004a3f02;
              pcVar31 = (char *)0x0;
              Curl_failf(data,"memory shortage");
              CVar26 = CURLE_OUT_OF_MEMORY;
            }
          }
          else {
            pcVar31 = (data->state).aptr.proxyuser;
            pcVar52 = (data->state).aptr.proxypasswd;
            if (pcVar31 == (char *)0x0) {
              pcVar31 = "";
            }
            if (pcVar52 == (char *)0x0) {
              pcVar52 = "";
            }
            ppcVar2 = &(conn->http_proxy).user;
            CVar26 = Curl_urldecode(pcVar31,0,ppcVar2,(size_t *)0x0,REJECT_ZERO);
            if ((CVar26 == CURLE_OK) &&
               (CVar26 = Curl_setstropt(&(data->state).aptr.proxyuser,*ppcVar2), CVar26 == CURLE_OK)
               ) {
              ppcVar2 = &(conn->http_proxy).passwd;
              CVar26 = Curl_urldecode(pcVar52,0,ppcVar2,(size_t *)0x0,REJECT_ZERO);
              if ((CVar26 == CURLE_OK) &&
                 (CVar26 = Curl_setstropt(&(data->state).aptr.proxypasswd,*ppcVar2),
                 CVar26 == CURLE_OK)) goto LAB_004a3e00;
            }
LAB_004a422c:
            local_160 = (curl_slist **)0x0;
            pcVar31 = (char *)0x0;
          }
LAB_004a422e:
          (*Curl_cfree)(pcVar31);
          (*Curl_cfree)(local_160);
          if (CVar26 != CURLE_OK) {
            return CVar26;
          }
          if (((conn->given->flags & 1) != 0) &&
             (uVar44 = *(uint *)&(conn->bits).field_0x4, (uVar44 & 1) != 0)) {
            *(uint *)&(conn->bits).field_0x4 = uVar44 | 8;
          }
          uVar23 = (data->set).use_port;
          if ((uVar23 != 0) && (((data->state).field_0x6d0 & 0x10) != 0)) {
            conn->remote_port = (uint)uVar23;
            curl_msnprintf((char *)&newurl,0x10,"%d");
            CVar24 = curl_url_set((data->state).uh,CURLUPART_PORT,(char *)&newurl,0);
            if (CVar24 != CURLUE_OK) goto switchD_004a384f_caseD_7;
          }
          if ((data->set).str[0x2c] != (char *)0x0) {
            (*Curl_cfree)(conn->options);
            pcVar31 = (*Curl_cstrdup)((data->set).str[0x2c]);
            conn->options = pcVar31;
            if (pcVar31 == (char *)0x0) goto switchD_004a384f_caseD_7;
          }
          ppcVar2 = &conn->user;
          passwordp = &conn->passwd;
          if ((data->set).use_netrc == '\x02') {
            (*Curl_cfree)(*ppcVar2);
            *ppcVar2 = (char *)0x0;
            (*Curl_cfree)(*passwordp);
            *passwordp = (char *)0x0;
          }
          puVar1 = &(conn->bits).field_0x6;
          *puVar1 = *puVar1 & 0xbf;
          ppcVar51 = ppcVar2;
          if (((data->set).use_netrc == '\0') || ((data->set).str[0x2a] != (char *)0x0)) {
            pcVar31 = *ppcVar2;
            if (pcVar31 != (char *)0x0) goto LAB_004a437b;
          }
          else {
            ppcVar3 = &(data->state).aptr.user;
            pcVar31 = (data->state).aptr.user;
            ppcVar51 = ppcVar3;
            if (pcVar31 == (char *)0x0) {
              ppcVar51 = ppcVar2;
            }
            iVar25 = Curl_parsenetrc((conn->host).name,ppcVar51,passwordp,(data->set).str[0x14]);
            if (iVar25 < 1) {
              if (iVar25 < 0) {
                Curl_failf(data,".netrc parser error");
                return CURLE_READ_ERROR;
              }
              puVar1 = &(conn->bits).field_0x6;
              *puVar1 = *puVar1 | 0x40;
            }
            else {
              Curl_infof(data,"Couldn\'t find host %s in the %s file; using defaults",
                         (conn->host).name,(data->set).str[0x14]);
            }
            if (pcVar31 != (char *)0x0) {
              (*Curl_cfree)(*ppcVar2);
              *ppcVar2 = (char *)0x0;
              pcVar31 = (*Curl_cstrdup)(*ppcVar3);
              *ppcVar2 = pcVar31;
              if (pcVar31 == (char *)0x0) goto switchD_004a384f_caseD_7;
            }
            pcVar31 = *ppcVar51;
            if (pcVar31 == (char *)0x0) {
              if (*passwordp == (char *)0x0) goto LAB_004a4398;
              pcVar31 = (*Curl_cstrdup)("");
              *ppcVar51 = pcVar31;
              if (pcVar31 == (char *)0x0) goto switchD_004a384f_caseD_7;
            }
LAB_004a437b:
            if (((data->state).aptr.user != pcVar31) &&
               (CVar26 = Curl_setstropt(&(data->state).aptr.user,pcVar31), CVar26 != CURLE_OK)) {
              return CVar26;
            }
          }
LAB_004a4398:
          pcVar31 = (data->state).aptr.user;
          if (pcVar31 != (char *)0x0) {
            CVar24 = curl_url_set((data->state).uh,CURLUPART_USER,pcVar31,0x80);
            switch(CVar24) {
            case CURLUE_OK:
              if (*ppcVar51 == (char *)0x0) {
                pcVar31 = (*Curl_cstrdup)((data->state).aptr.user);
                *ppcVar51 = pcVar31;
                if (pcVar31 == (char *)0x0) goto switchD_004a384f_caseD_7;
              }
              break;
            case CURLUE_BAD_HANDLE:
            case CURLUE_BAD_PARTPOINTER:
            case CURLUE_MALFORMED_INPUT:
            case CURLUE_BAD_PORT_NUMBER:
            case CURLUE_URLDECODE:
              return CURLE_URL_MALFORMAT;
            case CURLUE_UNSUPPORTED_SCHEME:
              goto switchD_004a3b53_caseD_5;
            case CURLUE_OUT_OF_MEMORY:
              goto switchD_004a384f_caseD_7;
            case CURLUE_USER_NOT_ALLOWED:
              goto switchD_004a384f_caseD_8;
            default:
              goto switchD_004a384f_caseD_1;
            }
          }
          if ((*passwordp != (char *)0x0) &&
             (CVar26 = Curl_setstropt(ppcVar48,*passwordp), CVar26 != CURLE_OK)) {
            return CVar26;
          }
          if (*ppcVar48 != (char *)0x0) {
            CVar24 = curl_url_set((data->state).uh,CURLUPART_PASSWORD,*ppcVar48,0x80);
            switch(CVar24) {
            case CURLUE_OK:
              if (*passwordp == (char *)0x0) {
                pcVar31 = (*Curl_cstrdup)(*ppcVar48);
                *passwordp = pcVar31;
                if (pcVar31 == (char *)0x0) goto switchD_004a384f_caseD_7;
              }
              break;
            default:
              return CURLE_URL_MALFORMAT;
            case CURLUE_UNSUPPORTED_SCHEME:
              goto switchD_004a3b53_caseD_5;
            case CURLUE_OUT_OF_MEMORY:
              goto switchD_004a384f_caseD_7;
            case CURLUE_USER_NOT_ALLOWED:
switchD_004a384f_caseD_8:
              return CURLE_LOGIN_DENIED;
            }
          }
          if (((conn->handler->flags & 0x20) == 0) || ((data->state).aptr.user != (char *)0x0)) {
            pcVar52 = "";
            pcVar31 = "";
          }
          else {
            pcVar52 = "ftp@example.com";
            pcVar31 = "anonymous";
          }
          if (*ppcVar2 == (char *)0x0) {
            pcVar31 = (*Curl_cstrdup)(pcVar31);
            *ppcVar2 = pcVar31;
            if (pcVar31 == (char *)0x0) goto switchD_004a384f_caseD_7;
          }
          if (*passwordp == (char *)0x0) {
            pcVar31 = (*Curl_cstrdup)(pcVar52);
            *passwordp = pcVar31;
            if (pcVar31 == (char *)0x0) {
              return CURLE_OUT_OF_MEMORY;
            }
          }
          local_160 = &(data->set).connect_to;
          local_c8 = &conn->conn_to_host;
          pcVar31 = (char *)0x0;
          uVar37 = 0xffffffff;
LAB_004a452b:
          if ((((int)uVar37 == -1) && (pcVar31 == (char *)0x0)) &&
             (pcVar6 = *local_160, pcVar6 != (curl_slist *)0x0)) {
            pcVar31 = pcVar6->data;
            if (*pcVar31 == ':') {
LAB_004a45eb:
              if (pcVar31[1] != ':') {
                pcVar52 = strchr(pcVar31 + 1,0x3a);
                if (pcVar52 != (char *)0x0) {
                  auVar15._8_8_ = 0;
                  auVar15._0_8_ = pcStack_b0;
                  _newurl = auVar15 << 0x40;
                  lVar36 = strtol(pcVar31 + 1,&newurl,10);
                  if ((newurl == pcVar52) && (lVar36 == conn->remote_port)) {
                    pcVar31 = pcVar52 + 1;
                    goto LAB_004a45fa;
                  }
                }
                goto LAB_004a46d7;
              }
              pcVar31 = pcVar31 + 2;
LAB_004a45fa:
              if (*pcVar31 == '\0') goto LAB_004a46d7;
              pbVar35 = (byte *)(*Curl_cstrdup)(pcVar31);
              if (pbVar35 != (byte *)0x0) {
                __s = pbVar35;
                local_110 = pbVar35;
                if (*pbVar35 == 0x5b) {
                  pbVar53 = pbVar35 + 2;
                  local_110 = pbVar35 + 1;
                  for (__s = local_110; bVar43 = *__s, bVar43 != 0; __s = __s + 1) {
                    if ((9 < (byte)(bVar43 - 0x30)) &&
                       ((0x38 < bVar43 - 0x2e ||
                        ((0x1f8000001f81001U >> ((ulong)(bVar43 - 0x2e) & 0x3f) & 1) == 0)))) {
                      if (bVar43 != 0x25) goto LAB_004a479f;
                      if (__s[1] - 0x32 == 0) {
                        iVar25 = 0x35 - (uint)__s[2];
                      }
                      else {
                        iVar25 = -(__s[1] - 0x32);
                      }
                      __s = pbVar53;
                      if (iVar25 != 0) {
                        Curl_infof(data,"Please URL encode %% as %%25, see RFC 6874.");
                      }
                      goto LAB_004a4763;
                    }
                    pbVar53 = pbVar53 + 1;
                  }
                  goto LAB_004a47ad;
                }
                goto LAB_004a47be;
              }
            }
            else {
              bVar54 = (*(uint *)&(conn->bits).field_0x4 >> 0xb & 1) == 0;
              pcVar52 = "[";
              if (bVar54) {
                pcVar52 = "";
              }
              pcVar47 = "]";
              if (bVar54) {
                pcVar47 = "";
              }
              pcVar52 = curl_maprintf("%s%s%s",pcVar52,(conn->host).name,pcVar47);
              if (pcVar52 != (char *)0x0) {
                sVar33 = strlen(pcVar52);
                iVar25 = Curl_strncasecompare(pcVar31,pcVar52,sVar33);
                (*Curl_cfree)(pcVar52);
                if ((iVar25 != 0) && (pcVar31[sVar33] == ':')) {
                  pcVar31 = pcVar31 + sVar33;
                  goto LAB_004a45eb;
                }
LAB_004a46d7:
                pcVar31 = (char *)0x0;
                uVar37 = 0xffffffff;
                goto LAB_004a46df;
              }
            }
            goto switchD_004a384f_caseD_7;
          }
          uVar44 = *(uint *)&(conn->bits).field_0x4;
          if ((uVar44 >> 9 & 1) != 0) {
            iVar25 = Curl_strcasecompare((conn->conn_to_host).name,(conn->host).name);
            uVar44 = *(uint *)&(conn->bits).field_0x4;
            if (iVar25 != 0) {
              uVar44 = uVar44 & 0xfffffdff;
              *(uint *)&(conn->bits).field_0x4 = uVar44;
            }
          }
          if (((uVar44 >> 10 & 1) != 0) && (conn->conn_to_port == conn->remote_port)) {
            uVar44 = uVar44 & 0xfffffbff;
            *(uint *)&(conn->bits).field_0x4 = uVar44;
          }
          if ((uVar44 & 1) != 0 && (uVar44 & 0x600) != 0) {
            *(uint *)&(conn->bits).field_0x4 = uVar44 | 8;
          }
          pCVar34 = conn->handler;
          if (pCVar34->setup_connection != (_func_CURLcode_Curl_easy_ptr_connectdata_ptr *)0x0) {
            CVar26 = (*pCVar34->setup_connection)(data,conn);
            if (CVar26 != CURLE_OK) {
              return CVar26;
            }
            pCVar34 = conn->handler;
          }
          if (conn->port < 0) {
            conn->port = pCVar34->defport;
          }
          conn->recv[0] = Curl_recv_plain;
          conn->send[0] = Curl_send_plain;
          conn->recv[1] = Curl_recv_plain;
          conn->send[1] = Curl_send_plain;
          *(uint *)&(conn->bits).field_0x4 =
               *(uint *)&(conn->bits).field_0x4 & 0xfdffffff |
               (uint)(*(ulong *)&(data->set).field_0x8e2 >> 0xe) & 0x2000000;
          if ((pCVar34->flags & 0x10) != 0) {
            Curl_persistconninfo(data,conn,(char *)0x0,-1);
            CVar26 = (*conn->handler->connect_it)(data,(_Bool *)&newurl);
            if (CVar26 == CURLE_OK) {
              (conn->bits).tcpconnect[0] = true;
              Curl_attach_connection(data,conn);
              CVar27 = Curl_conncache_add_conn(data);
              if (CVar27 != CURLE_OK) {
                return CVar27;
              }
              CVar27 = setup_range(data);
              if (CVar27 != CURLE_OK) {
                (*conn->handler->done)(data,CVar27,false);
                return CVar27;
              }
              Curl_setup_transfer(data,-1,-1,false,-1);
            }
            Curl_init_do(data,conn);
            return CVar26;
          }
          pcVar31 = (data->set).str[0x1c];
          (data->set).ssl.primary.CApath = (data->set).str[0x1a];
          (data->set).ssl.primary.CAfile = pcVar31;
          (data->set).ssl.primary.issuercert = (data->set).str[0x27];
          (data->set).ssl.primary.issuercert_blob = (data->set).blobs[4];
          (data->set).ssl.primary.cipher_list = (data->set).str[0x20];
          (data->set).ssl.primary.cipher_list13 = (data->set).str[0x22];
          (data->set).ssl.primary.pinned_key = (data->set).str[0x1e];
          (data->set).ssl.primary.cert_blob = (data->set).blobs[0];
          (data->set).ssl.primary.ca_info_blob = (data->set).blobs[6];
          (data->set).ssl.primary.curves = (data->set).str[0x4b];
          pcVar31 = (data->set).str[0x1d];
          (data->set).proxy_ssl.primary.CApath = (data->set).str[0x1b];
          (data->set).proxy_ssl.primary.CAfile = pcVar31;
          (data->set).proxy_ssl.primary.cipher_list = (data->set).str[0x21];
          (data->set).proxy_ssl.primary.cipher_list13 = (data->set).str[0x23];
          (data->set).proxy_ssl.primary.pinned_key = (data->set).str[0x1f];
          (data->set).proxy_ssl.primary.cert_blob = (data->set).blobs[1];
          (data->set).proxy_ssl.primary.ca_info_blob = (data->set).blobs[7];
          (data->set).proxy_ssl.primary.issuercert = (data->set).str[0x28];
          (data->set).proxy_ssl.primary.issuercert_blob = (data->set).blobs[5];
          (data->set).proxy_ssl.primary.CRLfile = (data->set).str[0x26];
          (data->set).proxy_ssl.cert_type = (data->set).str[3];
          (data->set).proxy_ssl.key = (data->set).str[0xe];
          (data->set).proxy_ssl.key_type = (data->set).str[0x12];
          (data->set).proxy_ssl.key_passwd = (data->set).str[0x10];
          pcVar31 = (data->set).str[2];
          (data->set).proxy_ssl.primary.clientcert = (data->set).str[1];
          (data->set).proxy_ssl.key_blob = (data->set).blobs[3];
          (data->set).ssl.primary.CRLfile = (data->set).str[0x25];
          (data->set).ssl.cert_type = pcVar31;
          (data->set).ssl.key = (data->set).str[0xd];
          (data->set).ssl.key_type = (data->set).str[0x11];
          (data->set).ssl.key_passwd = (data->set).str[0xf];
          (data->set).ssl.primary.clientcert = (data->set).str[0];
          (data->set).ssl.key_blob = (data->set).blobs[2];
          dest = &conn->ssl_config;
          _Var22 = Curl_clone_primary_ssl_config(&(data->set).ssl.primary,dest);
          if (!_Var22) goto switchD_004a384f_caseD_7;
          _Var22 = Curl_clone_primary_ssl_config
                             (&(data->set).proxy_ssl.primary,&conn->proxy_ssl_config);
          if (!_Var22) {
            return CURLE_OUT_OF_MEMORY;
          }
          cVar58 = Curl_now();
          if (data->share != (Curl_share *)0x0) {
            Curl_share_lock(data,CURL_LOCK_DATA_CONNECT,CURL_LOCK_ACCESS_SINGLE);
          }
          pcVar7 = (data->state).conn_cache;
          uVar10 = (pcVar7->last_cleanup).tv_sec;
          uVar11 = (pcVar7->last_cleanup).tv_usec;
          older.tv_usec = uVar11;
          older.tv_sec = uVar10;
          newer._12_4_ = 0;
          newer.tv_sec = SUB128(cVar58._0_12_,0);
          newer.tv_usec = SUB124(cVar58._0_12_,8);
          older._12_4_ = 0;
          tVar38 = Curl_timediff(newer,older);
          if (data->share != (Curl_share *)0x0) {
            Curl_share_unlock(data,CURL_LOCK_DATA_CONNECT);
          }
          if (999 < tVar38) {
            pcStack_b0 = (connectdata *)0x0;
            newurl = (char *)data;
            while (_Var22 = Curl_conncache_foreach
                                      (data,(data->state).conn_cache,&newurl,call_extract_if_dead),
                  _Var22) {
              Curl_conncache_remove_conn(data,pcStack_b0,true);
              Curl_disconnect(data,pcStack_b0,true);
            }
            if (data->share == (Curl_share *)0x0) {
              pcVar7 = (data->state).conn_cache;
              (pcVar7->last_cleanup).tv_sec = cVar58.tv_sec;
              (pcVar7->last_cleanup).tv_usec = cVar58.tv_usec;
            }
            else {
              Curl_share_lock(data,CURL_LOCK_DATA_CONNECT,CURL_LOCK_ACCESS_SINGLE);
              pCVar8 = data->share;
              pcVar7 = (data->state).conn_cache;
              (pcVar7->last_cleanup).tv_sec = cVar58.tv_sec;
              (pcVar7->last_cleanup).tv_usec = cVar58.tv_usec;
              if (pCVar8 != (Curl_share *)0x0) {
                Curl_share_unlock(data,CURL_LOCK_DATA_CONNECT);
              }
            }
          }
          if (((((data->set).field_0x8e5 & 0x40) == 0) || (((data->state).field_0x6d0 & 2) != 0)) &&
             ((data->set).connect_only == '\0')) {
            bVar54 = true;
            if ((((conn->handler->protocol & 3) != 0) &&
                ((~*(uint *)&(conn->bits).field_0x4 & 0x4040) != 0)) &&
               (_Var22 = Curl_multiplex_wanted(data->multi), _Var22)) {
              bVar54 = (data->state).httpwant < 3;
            }
            if (((data->state).authhost.want & 0x28) == 0) {
              bVar55 = false;
            }
            else {
              bVar55 = (conn->handler->protocol & 3) != 0;
            }
            if ((((conn->bits).field_0x4 & 4) == 0) || (((data->state).authproxy.want & 0x28) == 0))
            {
              bVar56 = false;
            }
            else {
              bVar56 = (conn->handler->protocol & 3) != 0;
            }
            pcVar39 = Curl_conncache_find_bundle(data,conn,(data->state).conn_cache);
            if (pcVar39 == (connectbundle *)0x0) {
              bVar54 = false;
LAB_004a5cd3:
              if (data->share != (Curl_share *)0x0) {
                Curl_share_unlock(data,CURL_LOCK_DATA_CONNECT);
              }
              if ((!bVar54) || (((data->set).field_0x8e7 & 4) == 0)) goto LAB_004a501e;
              Curl_infof(data,"Found pending candidate for reuse and CURLOPT_PIPEWAIT is set");
              bVar54 = true;
              goto LAB_004a5020;
            }
            pcVar31 = "serially";
            if (pcVar39->multiuse == 2) {
              pcVar31 = "can multiplex";
            }
            bVar57 = false;
            Curl_infof(data,"Found bundle for host: %p [%s]",pcVar39,pcVar31);
            if (!bVar54) {
              iVar25 = pcVar39->multiuse;
              bVar57 = iVar25 != 0;
              if (!bVar57) {
                if (((data->set).field_0x8e7 & 4) != 0) {
                  Curl_infof(data,"Server doesn\'t support multiplex yet, wait");
                  bVar54 = true;
                  if (data->share != (Curl_share *)0x0) {
                    Curl_share_unlock(data,CURL_LOCK_DATA_CONNECT);
                  }
                  goto LAB_004a5020;
                }
                Curl_infof(data,"Server doesn\'t support multiplex (yet)");
                iVar25 = pcVar39->multiuse;
              }
              if ((iVar25 == 2) && (_Var22 = Curl_multiplex_wanted(data->multi), !_Var22)) {
                bVar57 = false;
                Curl_infof(data,"Could multiplex, but not asked to");
              }
              if (pcVar39->multiuse == -1) {
                bVar57 = false;
                Curl_infof(data,"Can not multiplex, even if we wanted to");
              }
            }
            pCVar49 = (pcVar39->conn_list).head;
            local_d0 = &conn->socks_proxy;
            local_e8 = &(conn->socks_proxy).user;
            local_d8 = &conn->http_proxy;
            ppcVar48 = &(conn->http_proxy).user;
            local_118 = (connectdata *)0x0;
            bVar20 = false;
LAB_004a539f:
            do {
              while( true ) {
                do {
                  bVar54 = bVar20;
                  if (pCVar49 == (Curl_llist_element *)0x0) {
                    pcVar40 = local_118;
                    if (local_118 == (connectdata *)0x0) goto LAB_004a5cd3;
                    goto LAB_004a5ab6;
                  }
                  pcVar40 = (connectdata *)pCVar49->ptr;
                  pCVar49 = pCVar49->next;
                  bVar20 = bVar54;
                } while ((pcVar40->connect_only != '\0') ||
                        (((pcVar40->bits).field_0x4 & 0x40) != 0));
                _Var22 = extract_if_dead(pcVar40,data);
                if (!_Var22) break;
                Curl_disconnect(data,pcVar40,true);
              }
              uVar5 = (data->set).ipver;
            } while ((uVar5 != '\0') && (uVar5 != pcVar40->ip_version));
            if (pcVar39->multiuse == 2) {
              local_120 = (pcVar40->easyq).size;
              bVar17 = true;
              if (!bVar57) {
                if (local_120 == 0) {
LAB_004a5443:
                  if (pcVar40->sock[0] != -1) {
                    bVar17 = false;
                    goto LAB_004a5454;
                  }
                  Curl_infof(data,"Connection #%ld isn\'t open enough, can\'t reuse",
                             pcVar40->connection_id);
                  bVar20 = true;
                }
                goto LAB_004a539f;
              }
            }
            else {
              if (!bVar57) goto LAB_004a5443;
              bVar17 = true;
LAB_004a5454:
              local_120 = 0;
            }
            if (((pcVar40->handler->flags ^ conn->handler->flags) & 1) == 0) {
              uVar44 = *(uint *)&(pcVar40->bits).field_0x4;
            }
            else if ((pcVar40->handler->family != conn->handler->protocol) ||
                    (uVar44 = *(uint *)&(pcVar40->bits).field_0x4, (uVar44 >> 0x1c & 1) == 0))
            goto LAB_004a539f;
            uVar45 = *(uint *)&(conn->bits).field_0x4;
            uVar46 = uVar45 ^ uVar44;
            if (((uVar46 & 1) != 0) ||
               (uVar50 = uVar45 >> 1 & 1, uVar50 != ((uVar44 >> 1 & 1) != 0))) goto LAB_004a539f;
            if (uVar50 != 0) {
              _Var22 = proxy_info_matches(local_d0,&pcVar40->socks_proxy);
              if (((!_Var22) ||
                  (iVar25 = Curl_timestrcmp(*local_e8,(pcVar40->socks_proxy).user), iVar25 != 0)) ||
                 (iVar25 = Curl_timestrcmp((conn->socks_proxy).passwd,(pcVar40->socks_proxy).passwd)
                 , iVar25 != 0)) goto LAB_004a539f;
              uVar45 = *(uint *)&(conn->bits).field_0x4;
              uVar46 = *(uint *)&(pcVar40->bits).field_0x4 ^ uVar45;
            }
            if (((uVar46 & 0x600) != 0) ||
               (((uVar45 & 1) != 0 &&
                (((_Var22 = proxy_info_matches(local_d8,&pcVar40->http_proxy), !_Var22 ||
                  (((*(uint *)&(pcVar40->bits).field_0x4 ^ *(uint *)&(conn->bits).field_0x4) & 8) !=
                   0)) || (((conn->http_proxy).proxytype == '\x02' &&
                           (((((conn->handler->flags & 1) != 0 &&
                              ((_Var22 = Curl_ssl_config_matches
                                                   (&conn->proxy_ssl_config,
                                                    &pcVar40->proxy_ssl_config), !_Var22 ||
                               (pcVar40->proxy_ssl[0].state != ssl_connection_complete)))) ||
                             (_Var22 = Curl_ssl_config_matches(dest,&pcVar40->ssl_config), !_Var22))
                            || (pcVar40->ssl[0].state != ssl_connection_complete))))))))))
            goto LAB_004a539f;
            sVar32 = (pcVar40->easyq).size;
            if (bVar17) {
              if ((sVar32 != 0) &&
                 (*(Curl_multi **)((long)((pcVar40->easyq).head)->ptr + 0xb8) != data->multi))
              goto LAB_004a539f;
            }
            else if (sVar32 != 0) goto LAB_004a539f;
            pcVar31 = conn->localdev;
            if ((pcVar31 != (char *)0x0 || conn->localport != 0) &&
               (((pcVar40->localport != conn->localport ||
                 (pcVar40->localportrange != conn->localportrange)) ||
                ((pcVar31 != (char *)0x0 &&
                 ((pcVar40->localdev == (char *)0x0 ||
                  (iVar25 = strcmp(pcVar40->localdev,pcVar31), iVar25 != 0))))))))
            goto LAB_004a539f;
            pCVar34 = conn->handler;
            if ((pCVar34->flags & 0x80) == 0) {
              iVar25 = Curl_timestrcmp(*ppcVar2,pcVar40->user);
              if ((((iVar25 != 0) ||
                   (iVar25 = Curl_timestrcmp(*passwordp,pcVar40->passwd), iVar25 != 0)) ||
                  (iVar25 = Curl_timestrcmp(conn->sasl_authzid,pcVar40->sasl_authzid), iVar25 != 0))
                 || (iVar25 = Curl_timestrcmp(conn->oauth_bearer,pcVar40->oauth_bearer), iVar25 != 0
                    )) goto LAB_004a539f;
              pCVar34 = conn->handler;
            }
            if (((((pCVar34->protocol & 3) != 0) && (0x13 < pcVar40->httpversion)) &&
                ((data->state).httpwant < 3)) || (pCVar34->family == 0x30)) goto LAB_004a539f;
            if (((pCVar34->flags & 1) != 0) || ((*(uint *)&(conn->bits).field_0x4 & 9) != 1)) {
              iVar25 = Curl_strcasecompare(pCVar34->scheme,pcVar40->handler->scheme);
              if ((iVar25 == 0) &&
                 ((pcVar40->handler->family != conn->handler->protocol ||
                  (((pcVar40->bits).field_0x7 & 0x10) == 0)))) goto LAB_004a539f;
              uVar44 = *(uint *)&(conn->bits).field_0x4;
              if ((uVar44 >> 9 & 1) != 0) {
                iVar25 = Curl_strcasecompare((conn->conn_to_host).name,(pcVar40->conn_to_host).name)
                ;
                if (iVar25 == 0) goto LAB_004a539f;
                uVar44 = *(uint *)&(conn->bits).field_0x4;
              }
              if ((((((uVar44 >> 10 & 1) != 0) && (conn->conn_to_port != pcVar40->conn_to_port)) ||
                   (iVar25 = Curl_strcasecompare((conn->host).name,(pcVar40->host).name),
                   iVar25 == 0)) || (conn->remote_port != pcVar40->remote_port)) ||
                 (((conn->handler->flags & 1) != 0 &&
                  ((_Var22 = Curl_ssl_config_matches(dest,&pcVar40->ssl_config), !_Var22 ||
                   (bVar20 = true, pcVar40->ssl[0].state != ssl_connection_complete))))))
              goto LAB_004a539f;
            }
            if (bVar55) {
              iVar25 = Curl_timestrcmp(*ppcVar2,pcVar40->user);
              if ((iVar25 != 0) ||
                 (iVar25 = Curl_timestrcmp(*passwordp,pcVar40->passwd), iVar25 != 0)) {
                bVar20 = bVar54;
                if (pcVar40->http_ntlm_state == NTLMSTATE_NONE) {
                  local_118 = pcVar40;
                }
                goto LAB_004a539f;
              }
            }
            else {
              bVar20 = bVar54;
              if (pcVar40->http_ntlm_state != NTLMSTATE_NONE) goto LAB_004a539f;
            }
            if (bVar56) {
              pcVar31 = (pcVar40->http_proxy).user;
              bVar20 = bVar54;
              if ((((pcVar31 == (char *)0x0) || ((pcVar40->http_proxy).passwd == (char *)0x0)) ||
                  (iVar25 = Curl_timestrcmp(*ppcVar48,pcVar31), iVar25 != 0)) ||
                 (iVar25 = Curl_timestrcmp((conn->http_proxy).passwd,(pcVar40->http_proxy).passwd),
                 iVar25 != 0)) goto LAB_004a539f;
LAB_004a59f1:
              if (((bVar55) && (pcVar40->http_ntlm_state != NTLMSTATE_NONE)) ||
                 ((local_118 = pcVar40, bVar20 = bVar54, bVar56 &&
                  (pcVar40->proxy_ntlm_state != NTLMSTATE_NONE)))) goto LAB_004a5ab6;
              goto LAB_004a539f;
            }
            bVar20 = bVar54;
            if (pcVar40->proxy_ntlm_state != NTLMSTATE_NONE) goto LAB_004a539f;
            if (bVar55) goto LAB_004a59f1;
            if (!(bool)(bVar17 & local_120 != 0)) goto LAB_004a5ab6;
            if (((pcVar40->bits).field_0x7 & 1) != 0) {
              if (local_120 < (pcVar40->proto).httpc.settings.max_concurrent_streams) {
                uVar44 = Curl_multi_max_concurrent_streams(data->multi);
                if (local_120 < uVar44) goto LAB_004a602f;
                pcVar31 = "client side MAX_CONCURRENT_STREAMS reached, skip (%zu)";
              }
              else {
                pcVar31 = "MAX_CONCURRENT_STREAMS reached, skip (%zu)";
              }
              Curl_infof(data,pcVar31,local_120);
              goto LAB_004a539f;
            }
LAB_004a602f:
            Curl_infof(data,"Multiplexed connection found");
LAB_004a5ab6:
            Curl_attach_connection(data,pcVar40);
            if (data->share != (Curl_share *)0x0) {
              Curl_share_unlock(data,CURL_LOCK_DATA_CONNECT);
            }
            auStack_98 = SUB1614((undefined1  [16])0x0,2);
            local_ec = -1;
            auStack_a8 = SUB1614((undefined1  [16])0x0,0);
            local_9a = 0;
            _newurl = (undefined1  [16])0x0;
            if (*ppcVar2 != (char *)0x0) {
              (*Curl_cfree)(pcVar40->user);
              pcVar40->user = (char *)0x0;
              (*Curl_cfree)(pcVar40->passwd);
              pcVar40->passwd = (char *)0x0;
              pcVar31 = conn->passwd;
              pcVar40->user = *ppcVar2;
              pcVar40->passwd = pcVar31;
              conn->user = (char *)0x0;
              conn->passwd = (char *)0x0;
            }
            uVar44 = *(uint *)&(conn->bits).field_0x4 & 4;
            *(uint *)&(pcVar40->bits).field_0x4 =
                 *(uint *)&(pcVar40->bits).field_0x4 & 0xfffffffb | uVar44;
            if (uVar44 != 0) {
              (*Curl_cfree)((pcVar40->http_proxy).user);
              (pcVar40->http_proxy).user = (char *)0x0;
              (*Curl_cfree)((pcVar40->socks_proxy).user);
              (pcVar40->socks_proxy).user = (char *)0x0;
              (*Curl_cfree)((pcVar40->http_proxy).passwd);
              (pcVar40->http_proxy).passwd = (char *)0x0;
              (*Curl_cfree)((pcVar40->socks_proxy).passwd);
              (pcVar40->socks_proxy).passwd = (char *)0x0;
              pcVar31 = (conn->http_proxy).passwd;
              (pcVar40->http_proxy).user = *ppcVar48;
              (pcVar40->http_proxy).passwd = pcVar31;
              pcVar31 = local_e8[1];
              (pcVar40->socks_proxy).user = *local_e8;
              (pcVar40->socks_proxy).passwd = pcVar31;
              local_e8[0] = (char *)0x0;
              local_e8[1] = (char *)0x0;
              (conn->http_proxy).user = (char *)0x0;
              (conn->http_proxy).passwd = (char *)0x0;
            }
            (*Curl_cfree)((pcVar40->host).rawalloc);
            (pcVar40->host).rawalloc = (char *)0x0;
            (*Curl_cfree)((pcVar40->conn_to_host).rawalloc);
            (pcVar40->conn_to_host).rawalloc = (char *)0x0;
            pcVar31 = local_c0->encalloc;
            pcVar52 = local_c0->name;
            pcVar47 = local_c0->dispname;
            (pcVar40->host).rawalloc = local_c0->rawalloc;
            (pcVar40->host).encalloc = pcVar31;
            (pcVar40->host).name = pcVar52;
            (pcVar40->host).dispname = pcVar47;
            local_c0->rawalloc = (char *)0x0;
            local_c0->encalloc = (char *)0x0;
            pcVar31 = local_c8->rawalloc;
            pcVar52 = local_c8->encalloc;
            pcVar47 = local_c8->dispname;
            (pcVar40->conn_to_host).name = local_c8->name;
            (pcVar40->conn_to_host).dispname = pcVar47;
            (pcVar40->conn_to_host).rawalloc = pcVar31;
            (pcVar40->conn_to_host).encalloc = pcVar52;
            (conn->conn_to_host).rawalloc = (char *)0x0;
            iVar25 = conn->conn_to_port;
            pcVar40->remote_port = conn->remote_port;
            pcVar40->conn_to_port = iVar25;
            (*Curl_cfree)(pcVar40->hostname_resolve);
            pcVar40->hostname_resolve = (char *)0x0;
            pcVar40->hostname_resolve = conn->hostname_resolve;
            conn->hostname_resolve = (char *)0x0;
            if (pcVar40->transport == '\x03') {
              Curl_conninfo_local(data,pcVar40->sock[0],(char *)&newurl,&local_ec);
              iVar25 = local_ec;
            }
            else {
              iVar25 = -1;
            }
            Curl_persistconninfo(data,pcVar40,(char *)&newurl,iVar25);
            puVar1 = &(pcVar40->bits).field_0x4;
            *puVar1 = *puVar1 | 0x80;
            conn_free(conn);
            *in_connect = pcVar40;
            pcVar31 = "proxy";
            if (((pcVar40->bits).field_0x4 & 0x20) == 0) {
              pcVar31 = "host";
            }
            lVar36 = 0xf0;
            if (((pcVar40->socks_proxy).host.name == (char *)0x0) &&
               (lVar36 = 0x130, (pcVar40->http_proxy).host.name == (char *)0x0)) {
              lVar36 = 0xa0;
            }
            Curl_infof(data,"Re-using existing connection #%ld with %s %s",pcVar40->connection_id,
                       pcVar31,*(undefined8 *)((pcVar40->chunk).hexbuffer + lVar36 + -0x3d));
            conn = pcVar40;
          }
          else {
LAB_004a501e:
            bVar54 = false;
LAB_004a5020:
            if (((conn->handler->flags & 0x100) != 0) && (((data->set).field_0x8e7 & 1) != 0)) {
              puVar1 = &(conn->bits).field_0x7;
              *puVar1 = *puVar1 | 4;
            }
            if (bVar54) {
LAB_004a5046:
              Curl_infof(data,"No connections available.");
              conn_free(conn);
              *in_connect = (connectdata *)0x0;
              return CURLE_NO_CONNECTION_AVAILABLE;
            }
            pcVar39 = Curl_conncache_find_bundle(data,conn,(data->state).conn_cache);
            if ((pcVar39 == (connectbundle *)0x0 || sVar29 == 0) ||
               (pcVar39->num_connections < sVar29)) {
              if (data->share != (Curl_share *)0x0) {
                Curl_share_unlock(data,CURL_LOCK_DATA_CONNECT);
              }
            }
            else {
              pcVar40 = Curl_conncache_extract_bundle(data,pcVar39);
              if (data->share != (Curl_share *)0x0) {
                Curl_share_unlock(data,CURL_LOCK_DATA_CONNECT);
              }
              if (pcVar40 == (connectdata *)0x0) {
                Curl_infof(data,"No more connections allowed to host: %zu",sVar29);
                goto LAB_004a5046;
              }
              Curl_disconnect(data,pcVar40,false);
            }
            if ((local_e0 != 0) && (sVar29 = Curl_conncache_size(data), local_e0 <= sVar29)) {
              pcVar40 = Curl_conncache_extract_oldest(data);
              if (pcVar40 == (connectdata *)0x0) {
                Curl_infof(data,"No connections available in cache");
                goto LAB_004a5046;
              }
              Curl_disconnect(data,pcVar40,false);
            }
            Curl_attach_connection(data,conn);
            CVar26 = Curl_conncache_add_conn(data);
            if (CVar26 != CURLE_OK) {
              return CVar26;
            }
            if ((((data->state).authhost.picked & 0x28) != 0) &&
               (((data->state).authhost.field_0x18 & 1) != 0)) {
              Curl_infof(data,"NTLM picked AND auth done set, clear picked");
              (data->state).authhost.picked = 0;
              puVar1 = &(data->state).authhost.field_0x18;
              *puVar1 = *puVar1 & 0xfe;
            }
            if ((((data->state).authproxy.picked & 0x28) != 0) &&
               (((data->state).authproxy.field_0x18 & 1) != 0)) {
              Curl_infof(data,"NTLM-proxy picked AND auth done set, clear picked");
              (data->state).authproxy.picked = 0;
              puVar1 = &(data->state).authproxy.field_0x18;
              *puVar1 = *puVar1 & 0xfe;
            }
          }
          Curl_init_do(data,conn);
          CVar26 = setup_range(data);
          if (CVar26 != CURLE_OK) {
            return CVar26;
          }
          conn->seek_func = (data->set).seek_func;
          conn->seek_client = (data->set).seek_client;
          uVar44 = *(uint *)&(conn->bits).field_0x4;
          if ((char)uVar44 < '\0') {
            *async = false;
          }
          else {
            if ((uVar44 & 0x20) == 0) {
              auVar18._8_8_ = 0;
              auVar18._0_8_ = pcStack_b0;
              _newurl = auVar18 << 0x40;
              tVar38 = Curl_timeleft(data,(curltime *)0x0,true);
              uVar44 = *(uint *)&(conn->bits).field_0x4;
              lVar36 = 0xb8;
              if ((uVar44 >> 9 & 1) == 0) {
                lVar36 = 0x88;
              }
              conn->port = *(int *)((long)&conn->remote_port + (ulong)(uVar44 >> 8 & 4));
              pcVar31 = (*Curl_cstrdup)(*(char **)((long)(&conn->chunk + -1) + lVar36));
              conn->hostname_resolve = pcVar31;
              if (pcVar31 == (char *)0x0) {
                return CURLE_OUT_OF_MEMORY;
              }
              rVar28 = Curl_resolv_timeout(data,pcVar31,conn->port,(Curl_dns_entry **)&newurl,tVar38
                                          );
              conn->dns_entry = (Curl_dns_entry *)newurl;
              if (rVar28 == CURLRESOLV_TIMEDOUT) {
                uVar9 = *(undefined8 *)((conn->chunk).hexbuffer + lVar36 + -0x25);
                cVar58 = Curl_now();
                uVar12 = (data->progress).t_startsingle.tv_sec;
                uVar13 = (data->progress).t_startsingle.tv_usec;
                older_00.tv_usec = uVar13;
                older_00.tv_sec = uVar12;
                newer_00._12_4_ = 0;
                newer_00.tv_sec = SUB128(cVar58._0_12_,0);
                newer_00.tv_usec = SUB124(cVar58._0_12_,8);
                older_00._12_4_ = 0;
                tVar38 = Curl_timediff(newer_00,older_00);
                Curl_failf(data,"Failed to resolve host \'%s\' with timeout after %ld ms",uVar9,
                           tVar38);
                return CURLE_OPERATION_TIMEDOUT;
              }
              if (rVar28 != CURLRESOLV_PENDING) {
                if (newurl == (char *)0x0) {
                  Curl_failf(data,"Could not resolve host: %s",
                             *(undefined8 *)((conn->chunk).hexbuffer + lVar36 + -0x25));
                  return CURLE_COULDNT_RESOLVE_HOST;
                }
                return CURLE_OK;
              }
            }
            else {
              auVar19._8_8_ = 0;
              auVar19._0_8_ = pcStack_b0;
              _newurl = auVar19 << 0x40;
              tVar38 = Curl_timeleft(data,(curltime *)0x0,true);
              uVar37 = (ulong)(((conn->bits).field_0x4 & 2) == 0);
              pcVar31 = (*Curl_cstrdup)((char *)conn->tempaddr[uVar37 * 8 + 0xe]);
              conn->hostname_resolve = pcVar31;
              if (pcVar31 == (char *)0x0) {
switchD_004a3919_caseD_7:
                return CURLE_OUT_OF_MEMORY;
              }
              rVar28 = Curl_resolv_timeout(data,pcVar31,conn->port,(Curl_dns_entry **)&newurl,tVar38
                                          );
              conn->dns_entry = (Curl_dns_entry *)newurl;
              if (rVar28 == CURLRESOLV_TIMEDOUT) {
                return CURLE_OPERATION_TIMEDOUT;
              }
              if (rVar28 != CURLRESOLV_PENDING) {
                if (newurl == (char *)0x0) {
                  Curl_failf(data,"Couldn\'t resolve proxy \'%s\'",
                             *(undefined8 *)(conn->primary_ip + uVar37 * 0x40 + -0x68));
                  return CURLE_COULDNT_RESOLVE_PROXY;
                }
                return CURLE_OK;
              }
            }
            *async = true;
          }
          return CURLE_OK;
        default:
          goto switchD_004a384f_caseD_1;
        case CURLUE_UNSUPPORTED_SCHEME:
          goto switchD_004a3b53_caseD_5;
        case CURLUE_OUT_OF_MEMORY:
          goto switchD_004a384f_caseD_7;
        case CURLUE_USER_NOT_ALLOWED:
          goto switchD_004a384f_caseD_8;
        }
      default:
        if (CVar24 == CURLUE_OK) {
          pcVar31 = (*Curl_cstrdup)(*ppcVar2);
          conn->options = pcVar31;
          if (pcVar31 != (char *)0x0) goto switchD_004a3b53_caseD_d;
          goto switchD_004a384f_caseD_7;
        }
      case CURLUE_URLDECODE:
      case CURLUE_UNKNOWN_PART:
      case CURLUE_NO_SCHEME:
      case CURLUE_NO_USER:
      case CURLUE_NO_PASSWORD:
switchD_004a384f_caseD_1:
        CVar26 = CURLE_URL_MALFORMAT;
      }
      break;
    default:
      goto switchD_004a384f_caseD_1;
    case CURLUE_UNSUPPORTED_SCHEME:
      return CURLE_UNSUPPORTED_PROTOCOL;
    case CURLUE_OUT_OF_MEMORY:
      goto switchD_004a384f_caseD_7;
    case CURLUE_USER_NOT_ALLOWED:
      goto switchD_004a384f_caseD_8;
    }
  }
switchD_004a3919_caseD_1:
  return CVar26;
LAB_004a4763:
  bVar43 = *__s;
  if (bVar43 == 0) goto LAB_004a47ad;
  if ((((9 < (byte)(bVar43 - 0x30)) && (0x19 < (byte)((bVar43 & 0xdf) + 0xbf))) &&
      (1 < bVar43 - 0x2d)) && ((bVar43 != 0x7e && (bVar43 != 0x5f)))) goto LAB_004a479f;
  __s = __s + 1;
  goto LAB_004a4763;
LAB_004a479f:
  if (bVar43 == 0x5d) {
    *__s = 0;
    __s = __s + 1;
  }
  else {
LAB_004a47ad:
    Curl_infof(data,"Invalid IPv6 address format");
  }
LAB_004a47be:
  pcVar31 = strchr((char *)__s,0x3a);
  uVar37 = 0xffffffff;
  if (pcVar31 == (char *)0x0) {
LAB_004a4820:
    pcVar31 = (*Curl_cstrdup)((char *)local_110);
    CVar26 = CURLE_OK;
    if (pcVar31 == (char *)0x0) {
      CVar26 = CURLE_OUT_OF_MEMORY;
      goto LAB_004a486e;
    }
    bVar54 = true;
  }
  else {
    auVar16._8_8_ = 0;
    auVar16._0_8_ = pcStack_b0;
    _newurl = auVar16 << 0x40;
    *pcVar31 = '\0';
    uVar37 = 0xffffffff;
    if (pcVar31[1] == '\0') goto LAB_004a4820;
    uVar37 = strtol(pcVar31 + 1,&newurl,10);
    if (((newurl == (char *)0x0) || (*newurl == '\0')) && (uVar37 < 0x10000)) goto LAB_004a4820;
    Curl_failf(data,"No valid port number in connect to host string (%s)",pcVar31 + 1);
    CVar26 = CURLE_SETOPT_OPTION_SYNTAX;
LAB_004a486e:
    pcVar31 = (char *)0x0;
    bVar54 = false;
    uVar37 = 0xffffffff;
  }
  (*Curl_cfree)(pbVar35);
  if (!bVar54) {
    return CVar26;
  }
  if (pcVar31 == (char *)0x0) {
    pcVar31 = (char *)0x0;
  }
  else if (*pcVar31 != '\0') {
    (conn->conn_to_host).rawalloc = pcVar31;
    (conn->conn_to_host).name = pcVar31;
    puVar1 = &(conn->bits).field_0x5;
    *puVar1 = *puVar1 | 2;
    Curl_infof(data,"Connecting to hostname: %s",pcVar31);
    goto LAB_004a46f6;
  }
LAB_004a46df:
  puVar1 = &(conn->bits).field_0x5;
  *puVar1 = *puVar1 & 0xfd;
  (*Curl_cfree)(pcVar31);
  pcVar31 = (char *)0x0;
LAB_004a46f6:
  if ((int)uVar37 < 0) {
    puVar1 = &(conn->bits).field_0x5;
    *puVar1 = *puVar1 & 0xfb;
  }
  else {
    conn->conn_to_port = (int)uVar37;
    puVar1 = &(conn->bits).field_0x5;
    *puVar1 = *puVar1 | 4;
    Curl_infof(data,"Connecting to port: %d",uVar37 & 0xffffffff);
  }
  local_160 = &pcVar6->next;
  goto LAB_004a452b;
}

Assistant:

static CURLcode create_conn(struct Curl_easy *data,
                            struct connectdata **in_connect,
                            bool *async)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn;
  struct connectdata *conn_temp = NULL;
  bool reuse;
  bool connections_available = TRUE;
  bool force_reuse = FALSE;
  bool waitpipe = FALSE;
  size_t max_host_connections = Curl_multi_max_host_connections(data->multi);
  size_t max_total_connections = Curl_multi_max_total_connections(data->multi);

  *async = FALSE;
  *in_connect = NULL;

  /*************************************************************
   * Check input data
   *************************************************************/
  if(!data->state.url) {
    result = CURLE_URL_MALFORMAT;
    goto out;
  }

  /* First, split up the current URL in parts so that we can use the
     parts for checking against the already present connections. In order
     to not have to modify everything at once, we allocate a temporary
     connection data struct and fill in for comparison purposes. */
  conn = allocate_conn(data);

  if(!conn) {
    result = CURLE_OUT_OF_MEMORY;
    goto out;
  }

  /* We must set the return variable as soon as possible, so that our
     parent can cleanup any possible allocs we may have done before
     any failure */
  *in_connect = conn;

  result = parseurlandfillconn(data, conn);
  if(result)
    goto out;

  if(data->set.str[STRING_SASL_AUTHZID]) {
    conn->sasl_authzid = strdup(data->set.str[STRING_SASL_AUTHZID]);
    if(!conn->sasl_authzid) {
      result = CURLE_OUT_OF_MEMORY;
      goto out;
    }
  }

  if(data->set.str[STRING_BEARER]) {
    conn->oauth_bearer = strdup(data->set.str[STRING_BEARER]);
    if(!conn->oauth_bearer) {
      result = CURLE_OUT_OF_MEMORY;
      goto out;
    }
  }

#ifdef USE_UNIX_SOCKETS
  if(data->set.str[STRING_UNIX_SOCKET_PATH]) {
    conn->unix_domain_socket = strdup(data->set.str[STRING_UNIX_SOCKET_PATH]);
    if(!conn->unix_domain_socket) {
      result = CURLE_OUT_OF_MEMORY;
      goto out;
    }
    conn->bits.abstract_unix_socket = data->set.abstract_unix_socket;
  }
#endif

  /* After the unix socket init but before the proxy vars are used, parse and
     initialize the proxy vars */
#ifndef CURL_DISABLE_PROXY
  result = create_conn_helper_init_proxy(data, conn);
  if(result)
    goto out;

  /*************************************************************
   * If the protocol is using SSL and HTTP proxy is used, we set
   * the tunnel_proxy bit.
   *************************************************************/
  if((conn->given->flags&PROTOPT_SSL) && conn->bits.httpproxy)
    conn->bits.tunnel_proxy = TRUE;
#endif

  /*************************************************************
   * Figure out the remote port number and fix it in the URL
   *************************************************************/
  result = parse_remote_port(data, conn);
  if(result)
    goto out;

  /* Check for overridden login details and set them accordingly so that
     they are known when protocol->setup_connection is called! */
  result = override_login(data, conn);
  if(result)
    goto out;

  result = set_login(data, conn); /* default credentials */
  if(result)
    goto out;

  /*************************************************************
   * Process the "connect to" linked list of hostname/port mappings.
   * Do this after the remote port number has been fixed in the URL.
   *************************************************************/
  result = parse_connect_to_slist(data, conn, data->set.connect_to);
  if(result)
    goto out;


  /*************************************************************
   * Check whether the host and the "connect to host" are equal.
   * Do this after the hostnames have been IDN-converted.
   *************************************************************/
  if(conn->bits.conn_to_host &&
     strcasecompare(conn->conn_to_host.name, conn->host.name)) {
    conn->bits.conn_to_host = FALSE;
  }

  /*************************************************************
   * Check whether the port and the "connect to port" are equal.
   * Do this after the remote port number has been fixed in the URL.
   *************************************************************/
  if(conn->bits.conn_to_port && conn->conn_to_port == conn->remote_port) {
    conn->bits.conn_to_port = FALSE;
  }

#ifndef CURL_DISABLE_PROXY
  /*************************************************************
   * If the "connect to" feature is used with an HTTP proxy,
   * we set the tunnel_proxy bit.
   *************************************************************/
  if((conn->bits.conn_to_host || conn->bits.conn_to_port) &&
      conn->bits.httpproxy)
    conn->bits.tunnel_proxy = TRUE;
#endif

  /*************************************************************
   * Setup internals depending on protocol. Needs to be done after
   * we figured out what/if proxy to use.
   *************************************************************/
  result = setup_connection_internals(data, conn);
  if(result)
    goto out;

  conn->recv[FIRSTSOCKET] = Curl_recv_plain;
  conn->send[FIRSTSOCKET] = Curl_send_plain;
  conn->recv[SECONDARYSOCKET] = Curl_recv_plain;
  conn->send[SECONDARYSOCKET] = Curl_send_plain;

  conn->bits.tcp_fastopen = data->set.tcp_fastopen;

  /***********************************************************************
   * file: is a special case in that it doesn't need a network connection
   ***********************************************************************/
#ifndef CURL_DISABLE_FILE
  if(conn->handler->flags & PROTOPT_NONETWORK) {
    bool done;
    /* this is supposed to be the connect function so we better at least check
       that the file is present here! */
    DEBUGASSERT(conn->handler->connect_it);
    Curl_persistconninfo(data, conn, NULL, -1);
    result = conn->handler->connect_it(data, &done);

    /* Setup a "faked" transfer that'll do nothing */
    if(!result) {
      conn->bits.tcpconnect[FIRSTSOCKET] = TRUE; /* we are "connected */

      Curl_attach_connection(data, conn);
      result = Curl_conncache_add_conn(data);
      if(result)
        goto out;

      /*
       * Setup whatever necessary for a resumed transfer
       */
      result = setup_range(data);
      if(result) {
        DEBUGASSERT(conn->handler->done);
        /* we ignore the return code for the protocol-specific DONE */
        (void)conn->handler->done(data, result, FALSE);
        goto out;
      }
      Curl_setup_transfer(data, -1, -1, FALSE, -1);
    }

    /* since we skip do_init() */
    Curl_init_do(data, conn);

    goto out;
  }
#endif

  /* Get a cloned copy of the SSL config situation stored in the
     connection struct. But to get this going nicely, we must first make
     sure that the strings in the master copy are pointing to the correct
     strings in the session handle strings array!

     Keep in mind that the pointers in the master copy are pointing to strings
     that will be freed as part of the Curl_easy struct, but all cloned
     copies will be separately allocated.
  */
  data->set.ssl.primary.CApath = data->set.str[STRING_SSL_CAPATH];
  data->set.ssl.primary.CAfile = data->set.str[STRING_SSL_CAFILE];
  data->set.ssl.primary.issuercert = data->set.str[STRING_SSL_ISSUERCERT];
  data->set.ssl.primary.issuercert_blob = data->set.blobs[BLOB_SSL_ISSUERCERT];
  data->set.ssl.primary.cipher_list =
    data->set.str[STRING_SSL_CIPHER_LIST];
  data->set.ssl.primary.cipher_list13 =
    data->set.str[STRING_SSL_CIPHER13_LIST];
  data->set.ssl.primary.pinned_key =
    data->set.str[STRING_SSL_PINNEDPUBLICKEY];
  data->set.ssl.primary.cert_blob = data->set.blobs[BLOB_CERT];
  data->set.ssl.primary.ca_info_blob = data->set.blobs[BLOB_CAINFO];
  data->set.ssl.primary.curves = data->set.str[STRING_SSL_EC_CURVES];

#ifndef CURL_DISABLE_PROXY
  data->set.proxy_ssl.primary.CApath = data->set.str[STRING_SSL_CAPATH_PROXY];
  data->set.proxy_ssl.primary.CAfile = data->set.str[STRING_SSL_CAFILE_PROXY];
  data->set.proxy_ssl.primary.cipher_list =
    data->set.str[STRING_SSL_CIPHER_LIST_PROXY];
  data->set.proxy_ssl.primary.cipher_list13 =
    data->set.str[STRING_SSL_CIPHER13_LIST_PROXY];
  data->set.proxy_ssl.primary.pinned_key =
    data->set.str[STRING_SSL_PINNEDPUBLICKEY_PROXY];
  data->set.proxy_ssl.primary.cert_blob = data->set.blobs[BLOB_CERT_PROXY];
  data->set.proxy_ssl.primary.ca_info_blob =
    data->set.blobs[BLOB_CAINFO_PROXY];
  data->set.proxy_ssl.primary.issuercert =
    data->set.str[STRING_SSL_ISSUERCERT_PROXY];
  data->set.proxy_ssl.primary.issuercert_blob =
    data->set.blobs[BLOB_SSL_ISSUERCERT_PROXY];
  data->set.proxy_ssl.primary.CRLfile =
    data->set.str[STRING_SSL_CRLFILE_PROXY];
  data->set.proxy_ssl.cert_type = data->set.str[STRING_CERT_TYPE_PROXY];
  data->set.proxy_ssl.key = data->set.str[STRING_KEY_PROXY];
  data->set.proxy_ssl.key_type = data->set.str[STRING_KEY_TYPE_PROXY];
  data->set.proxy_ssl.key_passwd = data->set.str[STRING_KEY_PASSWD_PROXY];
  data->set.proxy_ssl.primary.clientcert = data->set.str[STRING_CERT_PROXY];
  data->set.proxy_ssl.key_blob = data->set.blobs[BLOB_KEY_PROXY];
#endif
  data->set.ssl.primary.CRLfile = data->set.str[STRING_SSL_CRLFILE];
  data->set.ssl.cert_type = data->set.str[STRING_CERT_TYPE];
  data->set.ssl.key = data->set.str[STRING_KEY];
  data->set.ssl.key_type = data->set.str[STRING_KEY_TYPE];
  data->set.ssl.key_passwd = data->set.str[STRING_KEY_PASSWD];
  data->set.ssl.primary.clientcert = data->set.str[STRING_CERT];
#ifdef USE_TLS_SRP
  data->set.ssl.primary.username = data->set.str[STRING_TLSAUTH_USERNAME];
  data->set.ssl.primary.password = data->set.str[STRING_TLSAUTH_PASSWORD];
#ifndef CURL_DISABLE_PROXY
  data->set.proxy_ssl.primary.username =
    data->set.str[STRING_TLSAUTH_USERNAME_PROXY];
  data->set.proxy_ssl.primary.password =
    data->set.str[STRING_TLSAUTH_PASSWORD_PROXY];
#endif
#endif
  data->set.ssl.key_blob = data->set.blobs[BLOB_KEY];

  if(!Curl_clone_primary_ssl_config(&data->set.ssl.primary,
                                    &conn->ssl_config)) {
    result = CURLE_OUT_OF_MEMORY;
    goto out;
  }

#ifndef CURL_DISABLE_PROXY
  if(!Curl_clone_primary_ssl_config(&data->set.proxy_ssl.primary,
                                    &conn->proxy_ssl_config)) {
    result = CURLE_OUT_OF_MEMORY;
    goto out;
  }
#endif

  prune_dead_connections(data);

  /*************************************************************
   * Check the current list of connections to see if we can
   * re-use an already existing one or if we have to create a
   * new one.
   *************************************************************/

  DEBUGASSERT(conn->user);
  DEBUGASSERT(conn->passwd);

  /* reuse_fresh is TRUE if we are told to use a new connection by force, but
     we only acknowledge this option if this is not a re-used connection
     already (which happens due to follow-location or during a HTTP
     authentication phase). CONNECT_ONLY transfers also refuse reuse. */
  if((data->set.reuse_fresh && !data->state.this_is_a_follow) ||
     data->set.connect_only)
    reuse = FALSE;
  else
    reuse = ConnectionExists(data, conn, &conn_temp, &force_reuse, &waitpipe);

  if(reuse) {
    /*
     * We already have a connection for this, we got the former connection in
     * the conn_temp variable and thus we need to cleanup the one we just
     * allocated before we can move along and use the previously existing one.
     */
    reuse_conn(data, conn, conn_temp);
    conn = conn_temp;
    *in_connect = conn;

#ifndef CURL_DISABLE_PROXY
    infof(data, "Re-using existing connection #%ld with %s %s",
          conn->connection_id,
          conn->bits.proxy?"proxy":"host",
          conn->socks_proxy.host.name ? conn->socks_proxy.host.dispname :
          conn->http_proxy.host.name ? conn->http_proxy.host.dispname :
          conn->host.dispname);
#else
    infof(data, "Re-using existing connection #%ld with host %s",
          conn->connection_id, conn->host.dispname);
#endif
  }
  else {
    /* We have decided that we want a new connection. However, we may not
       be able to do that if we have reached the limit of how many
       connections we are allowed to open. */

    if(conn->handler->flags & PROTOPT_ALPN) {
      /* The protocol wants it, so set the bits if enabled in the easy handle
         (default) */
      if(data->set.ssl_enable_alpn)
        conn->bits.tls_enable_alpn = TRUE;
    }

    if(waitpipe)
      /* There is a connection that *might* become usable for multiplexing
         "soon", and we wait for that */
      connections_available = FALSE;
    else {
      /* this gets a lock on the conncache */
      struct connectbundle *bundle =
        Curl_conncache_find_bundle(data, conn, data->state.conn_cache);

      if(max_host_connections > 0 && bundle &&
         (bundle->num_connections >= max_host_connections)) {
        struct connectdata *conn_candidate;

        /* The bundle is full. Extract the oldest connection. */
        conn_candidate = Curl_conncache_extract_bundle(data, bundle);
        CONNCACHE_UNLOCK(data);

        if(conn_candidate)
          Curl_disconnect(data, conn_candidate, FALSE);
        else {
          infof(data, "No more connections allowed to host: %zu",
                max_host_connections);
          connections_available = FALSE;
        }
      }
      else
        CONNCACHE_UNLOCK(data);

    }

    if(connections_available &&
       (max_total_connections > 0) &&
       (Curl_conncache_size(data) >= max_total_connections)) {
      struct connectdata *conn_candidate;

      /* The cache is full. Let's see if we can kill a connection. */
      conn_candidate = Curl_conncache_extract_oldest(data);
      if(conn_candidate)
        Curl_disconnect(data, conn_candidate, FALSE);
      else {
        infof(data, "No connections available in cache");
        connections_available = FALSE;
      }
    }

    if(!connections_available) {
      infof(data, "No connections available.");

      conn_free(conn);
      *in_connect = NULL;

      result = CURLE_NO_CONNECTION_AVAILABLE;
      goto out;
    }
    else {
      /*
       * This is a brand new connection, so let's store it in the connection
       * cache of ours!
       */
      Curl_attach_connection(data, conn);
      result = Curl_conncache_add_conn(data);
      if(result)
        goto out;
    }

#if defined(USE_NTLM)
    /* If NTLM is requested in a part of this connection, make sure we don't
       assume the state is fine as this is a fresh connection and NTLM is
       connection based. */
    if((data->state.authhost.picked & (CURLAUTH_NTLM | CURLAUTH_NTLM_WB)) &&
       data->state.authhost.done) {
      infof(data, "NTLM picked AND auth done set, clear picked");
      data->state.authhost.picked = CURLAUTH_NONE;
      data->state.authhost.done = FALSE;
    }

    if((data->state.authproxy.picked & (CURLAUTH_NTLM | CURLAUTH_NTLM_WB)) &&
       data->state.authproxy.done) {
      infof(data, "NTLM-proxy picked AND auth done set, clear picked");
      data->state.authproxy.picked = CURLAUTH_NONE;
      data->state.authproxy.done = FALSE;
    }
#endif
  }

  /* Setup and init stuff before DO starts, in preparing for the transfer. */
  Curl_init_do(data, conn);

  /*
   * Setup whatever necessary for a resumed transfer
   */
  result = setup_range(data);
  if(result)
    goto out;

  /* Continue connectdata initialization here. */

  /*
   * Inherit the proper values from the urldata struct AFTER we have arranged
   * the persistent connection stuff
   */
  conn->seek_func = data->set.seek_func;
  conn->seek_client = data->set.seek_client;

  /*************************************************************
   * Resolve the address of the server or proxy
   *************************************************************/
  result = resolve_server(data, conn, async);

out:
  return result;
}